

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Generic_Floor(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                    int arg4)

{
  bool bVar1;
  int crush;
  EFloor local_2c;
  EFloor type;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  if ((arg4 & 8U) == 0) {
    switch(arg3) {
    case 1:
      local_2c = floorLowerToHighest;
      break;
    case 2:
      local_2c = floorLowerToLowest;
      break;
    case 3:
      local_2c = floorLowerToNearest;
      break;
    case 4:
      local_2c = floorLowerToLowestCeiling;
      break;
    case 5:
      local_2c = floorLowerToCeiling;
      break;
    case 6:
      local_2c = floorLowerByTexture;
      break;
    default:
      local_2c = floorLowerByValue;
    }
  }
  else {
    switch(arg3) {
    case 1:
      local_2c = floorRaiseToHighest;
      break;
    case 2:
      local_2c = floorRaiseToLowest;
      break;
    case 3:
      local_2c = floorRaiseToNearest;
      break;
    case 4:
      local_2c = floorRaiseToLowestCeiling;
      break;
    case 5:
      local_2c = floorRaiseToCeiling;
      break;
    case 6:
      local_2c = floorRaiseByTexture;
      break;
    default:
      local_2c = floorRaiseByValue;
    }
  }
  crush = -1;
  if ((arg4 & 0x10U) != 0) {
    crush = 0x14;
  }
  bVar1 = EV_DoFloor(local_2c,(line_t_conflict *)ln,arg0,(double)arg1 / 8.0,(double)arg2,crush,
                     arg4 & 7,false,false);
  return (int)bVar1;
}

Assistant:

FUNC(LS_Generic_Floor)
// Generic_Floor (tag, speed, height, target, change/model/direct/crush)
{
	DFloor::EFloor type;

	if (arg4 & 8)
	{
		switch (arg3)
		{
			case 1: type = DFloor::floorRaiseToHighest;			break;
			case 2: type = DFloor::floorRaiseToLowest;			break;
			case 3: type = DFloor::floorRaiseToNearest;			break;
			case 4: type = DFloor::floorRaiseToLowestCeiling;	break;
			case 5: type = DFloor::floorRaiseToCeiling;			break;
			case 6: type = DFloor::floorRaiseByTexture;			break;
			default:type = DFloor::floorRaiseByValue;			break;
		}
	}
	else
	{
		switch (arg3)
		{
			case 1: type = DFloor::floorLowerToHighest;			break;
			case 2: type = DFloor::floorLowerToLowest;			break;
			case 3: type = DFloor::floorLowerToNearest;			break;
			case 4: type = DFloor::floorLowerToLowestCeiling;	break;
			case 5: type = DFloor::floorLowerToCeiling;			break;
			case 6: type = DFloor::floorLowerByTexture;			break;
			default:type = DFloor::floorLowerByValue;			break;
		}
	}

	return EV_DoFloor (type, ln, arg0, SPEED(arg1), arg2,
					   (arg4 & 16) ? 20 : -1, arg4 & 7, false);
					   
}